

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_2::SamplePosDistributionCase::init
          (SamplePosDistributionCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  EVP_PKEY_CTX *ctx_00;
  MessageBuilder local_320;
  MessageBuilder local_190;
  SamplePosDistributionCase *local_10;
  SamplePosDistributionCase *this_local;
  
  local_10 = this;
  if ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.m_renderTarget ==
      TARGET_TEXTURE) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                        super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_190,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_190,(char (*) [36])"Verifying gl_SamplePosition value:\n");
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [67])
                               "\t1) With non-multisample targets: Expect the center of the pixel.\n"
                       );
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [31])"\t2) With multisample targets:\n");
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [36])"\t\ta) Expect legal sample position.\n");
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [83])
                               "\t\tb) Sample position is unique within the set of all sample positions of a pixel.\n"
                       );
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [65])
                               "\t\tc) Sample position distribution is uniform or almost uniform.\n"
                       );
    ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_190);
  }
  else {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                        super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_320,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_320,(char (*) [36])"Verifying gl_SamplePosition value:\n");
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [67])
                               "\t1) With non-multisample targets: Expect the center of the pixel.\n"
                       );
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [31])"\t2) With multisample targets:\n");
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [36])"\t\ta) Expect legal sample position.\n");
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [65])
                               "\t\tb) Sample position distribution is uniform or almost uniform.\n"
                       );
    ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_320);
  }
  iVar1 = MultisampleRenderCase::init(&this->super_MultisampleRenderCase,ctx_00);
  return iVar1;
}

Assistant:

void SamplePosDistributionCase::init (void)
{
	// log the test method and expectations
	if (m_renderTarget == TARGET_TEXTURE)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying gl_SamplePosition value:\n"
			<< "	1) With non-multisample targets: Expect the center of the pixel.\n"
			<< "	2) With multisample targets:\n"
			<< "		a) Expect legal sample position.\n"
			<< "		b) Sample position is unique within the set of all sample positions of a pixel.\n"
			<< "		c) Sample position distribution is uniform or almost uniform.\n"
			<< tcu::TestLog::EndMessage;
	}
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying gl_SamplePosition value:\n"
			<< "	1) With non-multisample targets: Expect the center of the pixel.\n"
			<< "	2) With multisample targets:\n"
			<< "		a) Expect legal sample position.\n"
			<< "		b) Sample position distribution is uniform or almost uniform.\n"
			<< tcu::TestLog::EndMessage;
	}

	MultisampleRenderCase::init();
}